

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vminit.cpp
# Opt level: O0

void vm_init_base(vm_globals **vmg,vm_init_options *opts)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  CVmMemory *pCVar3;
  CVmTimeZoneCache *pCVar4;
  CVmMetaTable *pCVar5;
  CVmBifTADSGlobals *pCVar6;
  CVmTimeZoneCache *pCVar7;
  CVmSrcfTable *pCVar8;
  char *__format;
  undefined8 *in_RSI;
  EVP_PKEY_CTX *pEVar9;
  undefined8 *in_RDI;
  bool bVar10;
  bool bVar11;
  char buf [256];
  char *msg;
  int disp_map_err;
  char filecont_mapname [32];
  char filename_mapname [32];
  char *charset;
  char disp_mapname [32];
  char path [4096];
  osfildef *fp;
  CResLoader *map_loader;
  vm_globals *vmg__;
  char *in_stack_00001df8;
  char *in_stack_00001e00;
  char *in_stack_00001e08;
  CResLoader *in_stack_00001e10;
  CVmVarHeap *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  uint in_stack_ffffffffffffede4;
  size_t in_stack_ffffffffffffede8;
  CVmUndo *in_stack_ffffffffffffedf0;
  CVmBifTADSGlobals *this;
  CVmObjTable *in_stack_ffffffffffffee18;
  CVmVarHeapHybrid *in_stack_ffffffffffffee20;
  char local_11b8 [48];
  size_t in_stack_ffffffffffffee78;
  err_msg_t *in_stack_ffffffffffffee80;
  CResLoader *in_stack_ffffffffffffee88;
  err_msg_t **in_stack_ffffffffffffee90;
  osfildef *in_stack_ffffffffffffee98;
  char *in_stack_ffffffffffffeea0;
  CResLoader *in_stack_ffffffffffffeea8;
  undefined1 *local_1060;
  undefined1 local_1058 [4144];
  FILE *local_28;
  long local_20;
  vm_globals *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = vmglob_alloc();
  *local_8 = local_18;
  err_init(0x400);
  local_20 = (**(code **)(*(long *)*local_10 + 0x38))();
  iVar1 = err_is_message_file_loaded();
  if (((iVar1 == 0) && (local_20 != 0)) &&
     (local_28 = (FILE *)CResLoader::open_res_file
                                   (in_stack_00001e10,in_stack_00001e08,in_stack_00001e00,
                                    in_stack_00001df8), local_28 != (FILE *)0x0)) {
    err_load_message_file
              (in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
               (size_t *)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
               in_stack_ffffffffffffee78);
    fclose(local_28);
  }
  G_host_ifc_X = (CVmHostIfc *)*local_10;
  (**(code **)(*(long *)*local_10 + 0x90))();
  pEVar9 = (EVP_PKEY_CTX *)0x1000;
  os_build_full_path((char *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                     (char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                     (char *)in_stack_ffffffffffffedd8);
  CVmObjTable::init(&G_obj_table_X,pEVar9);
  pCVar2 = (CVmVarHeap *)operator_new(0x30);
  CVmVarHeapHybrid::CVmVarHeapHybrid(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  G_varheap_X = pCVar2;
  pCVar3 = (CVmMemory *)operator_new(0x10);
  CVmMemory::CVmMemory
            ((CVmMemory *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
             in_stack_ffffffffffffedd8);
  G_mem_X = pCVar3;
  pCVar4 = (CVmTimeZoneCache *)operator_new(0x38);
  CVmUndo::CVmUndo(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,in_stack_ffffffffffffede4);
  G_undo_X = (CVmUndo *)pCVar4;
  pCVar4 = (CVmTimeZoneCache *)G_undo_X;
  pCVar5 = (CVmMetaTable *)operator_new(0x20);
  CVmMetaTable::CVmMetaTable((CVmMetaTable *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
  G_meta_table_X = pCVar5;
  pCVar6 = (CVmBifTADSGlobals *)operator_new(0x20);
  pEVar9 = (EVP_PKEY_CTX *)0x5;
  CVmBifTable::CVmBifTable
            ((CVmBifTable *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
             (size_t)in_stack_ffffffffffffedd8);
  G_bif_table_X = (CVmBifTable *)pCVar6;
  this = (CVmBifTADSGlobals *)G_bif_table_X;
  pCVar7 = (CVmTimeZoneCache *)operator_new(0x50);
  CVmTimeZoneCache::CVmTimeZoneCache(pCVar4);
  G_tzcache_X = pCVar7;
  vm_register_metaclasses();
  CVmObjTads::class_init();
  CVmRun::init(&G_interpreter_X,pEVar9);
  G_debugger_X = (CVmDebug *)0x0;
  G_srcf_table_X = (CVmSrcfTable *)0x0;
  G_net_config_X = (TadsNetConfig *)0x0;
  vm_init_debugger();
  pCVar8 = (CVmSrcfTable *)operator_new(0x18);
  CVmSrcfTable::CVmSrcfTable(pCVar8);
  G_srcf_table_X = pCVar8;
  pCVar8 = G_srcf_table_X;
  CVmPredef::reset(&G_predef_X);
  G_preinit_mode_X = 0;
  pCVar6 = (CVmBifTADSGlobals *)operator_new(0x30);
  CVmBifTADSGlobals::CVmBifTADSGlobals(this);
  G_bif_tads_globals_X = pCVar6;
  pCVar6 = G_bif_tads_globals_X;
  CVmObjBigNum::init_cache();
  iVar1 = (int)((ulong)pCVar6 >> 0x20);
  G_image_loader_X = (CVmImageLoader *)0x0;
  local_1060 = (undefined1 *)local_10[2];
  if (local_1060 == (undefined1 *)0x0) {
    os_get_charmap((char *)pCVar8,iVar1);
    local_1060 = local_1058;
    G_disp_cset_name_X = (char *)0x0;
  }
  else {
    G_disp_cset_name_X =
         lib_copy_str((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0));
  }
  G_cmap_from_ui_X =
       CCharmapToUni::load(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  G_cmap_to_ui_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  os_get_charmap((char *)pCVar8,iVar1);
  G_cmap_from_fname_X =
       CCharmapToUni::load(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  G_cmap_to_fname_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  os_get_charmap((char *)pCVar8,iVar1);
  G_cmap_from_file_X =
       CCharmapToUni::load(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  G_cmap_to_file_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  if (local_10[3] == 0) {
    G_cmap_to_log_X = G_cmap_to_file_X;
    if (G_cmap_to_file_X != (CCharmapToLocal *)0x0) {
      CCharmap::add_ref(&G_cmap_to_file_X->super_CCharmap);
    }
  }
  else {
    G_cmap_to_log_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  }
  bVar10 = G_cmap_from_ui_X == (CCharmapToUni *)0x0;
  bVar11 = G_cmap_to_ui_X == (CCharmapToLocal *)0x0;
  if (G_cmap_from_ui_X == (CCharmapToUni *)0x0) {
    G_cmap_from_ui_X =
         CCharmapToUni::load(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  }
  if (G_cmap_to_ui_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_ui_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  }
  if (G_cmap_from_fname_X == (CCharmapToUni *)0x0) {
    G_cmap_from_fname_X =
         CCharmapToUni::load(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  }
  if (G_cmap_to_fname_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_fname_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  }
  if (G_cmap_from_file_X == (CCharmapToUni *)0x0) {
    G_cmap_from_file_X =
         CCharmapToUni::load(in_stack_ffffffffffffee88,(char *)in_stack_ffffffffffffee80);
  }
  if (G_cmap_to_file_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_file_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  }
  if (G_cmap_to_log_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_log_X = CCharmapToLocal::load(in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea0);
  }
  G_console_X = (CVmConsoleMain *)(**(code **)(*(long *)local_10[1] + 0x18))((long *)local_10[1],0);
  if (bVar10 || bVar11) {
    __format = err_get_msg(vm_messages,vm_message_count,0x906,1);
    sprintf(local_11b8,__format,local_1060);
    (**(code **)(*(long *)local_10[1] + 0x50))((long *)local_10[1],0,0,local_11b8,1);
  }
  return;
}

Assistant:

void vm_init_base(vm_globals **vmg, const vm_init_options *opts)
{
    /* 
     *   Allocate globals according to build-time configuration, then
     *   assign the global pointer to a local named vmg__.  This will
     *   ensure that the globals are accessible for all of the different
     *   build-time configurations.  
     */
    vm_globals *vmg__ = *vmg = vmglob_alloc();

    /* 
     *   in configurations where globals aren't passed as parameters, vmg__
     *   will never be referenced; explicitly reference it so that the
     *   compiler knows the assignment above is intentional even if it's not
     *   ever used in this particular build configuration
     */
    (void)vmg__;

    /* initialize the error stack */
    err_init(VM_ERR_STACK_BYTES);

    /* get the system resource loader from the host interface */
    CResLoader *map_loader = opts->hostifc->get_sys_res_loader();

    /* if an external message set hasn't been loaded, try loading one */
    if (!err_is_message_file_loaded() && map_loader != 0)
    {
        /* try finding a message file */
        osfildef *fp = map_loader->open_res_file(
            VM_ERR_MSG_FNAME, 0, VM_ERR_MSG_RESTYPE);
        if (fp != 0)
        {
            /* 
             *   try loading it - if that fails, we'll just be left with
             *   the built-in messages, so we won't have lost anything for
             *   trying 
             */
            err_load_vm_message_file(fp);
            
            /* we're done with the file */
            osfcls(fp);
        }
    }

    /* remember the host interface */
    G_host_ifc = opts->hostifc;

    /* initialize the system debug log file name */
    char path[OSFNMAX];
    opts->hostifc->get_special_file_path(path, sizeof(path), OS_GSP_LOGFILE);
    os_build_full_path(G_syslogfile, sizeof(G_syslogfile),
                       path, "tadslog.txt");

    /* create the object table */
    VM_IF_ALLOC_PRE_GLOBAL(G_obj_table = new CVmObjTable());
    G_obj_table->init(vmg0_);

    /* 
     *   Create the memory manager.  Empirically, our hybrid heap allocator
     *   is faster than the standard C++ run-time library's allocator on many
     *   platforms, so use it instead of hte basic 'malloc' allocator. 
     */
    G_varheap = new CVmVarHeapHybrid(G_obj_table);
    // G_varheap = new CVmVarHeapMalloc(); to use the system 'malloc' instead
    G_mem = new CVmMemory(vmg_ G_varheap);

    /* create the undo manager */
    G_undo = new CVmUndo(VM_UNDO_MAX_RECORDS, VM_UNDO_MAX_SAVEPTS);

    /* create the metafile and function set tables */
    G_meta_table = new CVmMetaTable(5);
    G_bif_table = new CVmBifTable(5);

    /* create the time zone cache */
    G_tzcache = new CVmTimeZoneCache();

    /* initialize the metaclass registration tables */
    vm_register_metaclasses();

    /* initialize the TadsObject class */
    CVmObjTads::class_init(vmg0_);

    /* create the byte-code interpreter */
    VM_IFELSE_ALLOC_PRE_GLOBAL(
        G_interpreter = new CVmRun(VM_STACK_SIZE, vm_init_stack_reserve()),
        G_interpreter->init());

    /* presume we won't create debugger information */
    G_debugger = 0;
    G_srcf_table = 0;

    /* presume we don't have a network configuration */
    G_net_config = 0;

    /* initialize the debugger if present */
    vm_init_debugger(vmg0_);

    /* create the source file table */
    G_srcf_table = new CVmSrcfTable();

    /* create the pre-defined object mapper */
    VM_IFELSE_ALLOC_PRE_GLOBAL(G_predef = new CVmPredef, G_predef->reset());

    /* presume we're in normal execution mode (not preinit) */
    G_preinit_mode = FALSE;

    /* allocate the TADS intrinsic function set's globals */
    G_bif_tads_globals = new CVmBifTADSGlobals(vmg0_);

    /* allocate the BigNumber register cache */
    CVmObjBigNum::init_cache();

    /* no image loader yet */
    G_image_loader = 0;

    /*
     *   If the caller explicitly specified a character set, use it.
     *   Otherwise, ask the OS layer for the default character set we
     *   should use. 
     */
    char disp_mapname[32];
    const char *charset = opts->charset;
    if (charset == 0)
    {
        /* the user did not specify a mapping - ask the OS for the default */
        os_get_charmap(disp_mapname, OS_CHARMAP_DISPLAY);

        /* use the name we got from the OS */
        charset = disp_mapname;

        /* there's no explicit global character set name setting to store */
        G_disp_cset_name = 0;
    }
    else
    {
        /* save the global character set name */
        G_disp_cset_name = lib_copy_str(charset);
    }

    /* create the display character maps */
    G_cmap_from_ui = CCharmapToUni::load(map_loader, charset);
    G_cmap_to_ui = CCharmapToLocal::load(map_loader, charset);

    /* create the filename character maps */
    char filename_mapname[32];
    os_get_charmap(filename_mapname, OS_CHARMAP_FILENAME);
    G_cmap_from_fname = CCharmapToUni::load(map_loader, filename_mapname);
    G_cmap_to_fname = CCharmapToLocal::load(map_loader, filename_mapname);

    /* create the file-contents character maps */
    char filecont_mapname[32];
    os_get_charmap(filecont_mapname, OS_CHARMAP_FILECONTENTS);
    G_cmap_from_file = CCharmapToUni::load(map_loader, filecont_mapname);
    G_cmap_to_file = CCharmapToLocal::load(map_loader, filecont_mapname);

    /* 
     *   If the caller specified a separate log-file character set, create
     *   the mapping.  Otherwise, just use the to-file mapper for log files.
     */
    if (opts->log_charset != 0)
    {
        /* load the specified log file output mapping */
        G_cmap_to_log = CCharmapToLocal::load(map_loader, opts->log_charset);
    }
    else
    {
        /* no log file mapping is specified, so use the generic file map */
        if ((G_cmap_to_log = G_cmap_to_file) != 0)
            G_cmap_to_log->add_ref();
    }

    /* make a note of whether we had any problems loading the maps */
    int disp_map_err = (G_cmap_from_ui == 0 || G_cmap_to_ui == 0);

    /* if we failed to create any of the maps, load defaults */
    if (G_cmap_from_ui == 0)
        G_cmap_from_ui = CCharmapToUni::load(map_loader, "us-ascii");
    if (G_cmap_to_ui == 0)
        G_cmap_to_ui = CCharmapToLocal::load(map_loader, "us-ascii");
    if (G_cmap_from_fname == 0)
        G_cmap_from_fname = CCharmapToUni::load(map_loader, "us-ascii");
    if (G_cmap_to_fname == 0)
        G_cmap_to_fname = CCharmapToLocal::load(map_loader, "us-ascii");
    if (G_cmap_from_file == 0)
        G_cmap_from_file = CCharmapToUni::load(map_loader, "us-ascii");
    if (G_cmap_to_file == 0)
        G_cmap_to_file = CCharmapToLocal::load(map_loader, "us-ascii");
    if (G_cmap_to_log == 0)
        G_cmap_to_log = CCharmapToLocal::load(map_loader, "us-ascii");

    /* create the primary console */
    G_console = opts->clientifc->create_console(VMGLOB_ADDR);

    /* 
     *   if we had any trouble opening the display character mapping file,
     *   make a note that we are using a default mapping 
     */
    if (disp_map_err)
    {
        const char *msg;
        char buf[256];

        /* get the message */
        msg = err_get_msg(vm_messages, vm_message_count,
                          VMERR_NO_CHARMAP_FILE, TRUE);

        /* format it */
        sprintf(buf, msg, charset);

        /* display it */
        opts->clientifc->display_error(VMGLOB_ADDR, 0, buf, TRUE);
    }
}